

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O2

uint32 __thiscall
Protocol::MQTT::V5::FixedField<(Protocol::MQTT::Common::ControlPacketType)3>::copyInto
          (FixedField<(Protocol::MQTT::Common::ControlPacketType)3> *this,uint8 *buffer)

{
  uint32 uVar1;
  ushort uVar2;
  
  uVar1 = Common::DynamicString::copyInto(&(this->super_TopicAndID).topicName,buffer);
  if ((this->flags != (byte *)0x0) && ((*this->flags & 6) != 0)) {
    uVar2 = (this->super_TopicAndID).packetID;
    if (BigEndian(unsigned_short)::signature != '\x01') {
      if (BigEndian(unsigned_short)::signature == '\x04') {
        uVar2 = uVar2 << 8 | uVar2 >> 8;
      }
      else {
        uVar2 = 0;
      }
    }
    *(ushort *)(buffer + uVar1) = uVar2;
    uVar1 = uVar1 + 2;
  }
  return uVar1;
}

Assistant:

uint32 copyInto(uint8 * buffer) const
                {
                    uint32 o = topicName.copyInto(buffer);
                    if (hasPacketID())
                    {
                        uint16 p = BigEndian(packetID);
                        memcpy(buffer + o, &p, sizeof(p)); o += sizeof(p);
                    }
                    return o;
                }